

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O0

void xemmai::t_signature<long,int>::f_check<0ul,1ul>(t_pointer *a_stack)

{
  t_object *ptVar1;
  wchar_t *pwVar2;
  t_cs<L_1_> local_1f;
  t_cs<(wchar_t)97,(wchar_t)114,(wchar_t)103,(wchar_t)117,(wchar_t)109,(wchar_t)101,(wchar_t)110,(wchar_t)116>
  local_1e;
  t_cs local_1d [2];
  t_cs<L_0_> local_1b;
  t_cs<(wchar_t)97,(wchar_t)114,(wchar_t)103,(wchar_t)117,(wchar_t)109,(wchar_t)101,(wchar_t)110,(wchar_t)116>
  local_1a;
  t_cs local_19;
  t_pointer *local_18;
  t_pvalue *a_stack_local;
  
  local_18 = a_stack;
  ptVar1 = t_pointer::operator_cast_to_t_object_(a_stack);
  t_cs<(wchar_t)97,(wchar_t)114,(wchar_t)103,(wchar_t)117,(wchar_t)109,(wchar_t)101,(wchar_t)110,(wchar_t)116>
  ::operator+(&local_1a,&local_1b);
  pwVar2 = t_cs::operator_cast_to_wchar_t_(&local_19);
  f_check<long>(ptVar1,pwVar2);
  ptVar1 = t_pointer::operator_cast_to_t_object_(local_18 + 2);
  t_cs<(wchar_t)97,(wchar_t)114,(wchar_t)103,(wchar_t)117,(wchar_t)109,(wchar_t)101,(wchar_t)110,(wchar_t)116>
  ::operator+(&local_1e,&local_1f);
  pwVar2 = t_cs::operator_cast_to_wchar_t_(local_1d);
  f_check<int>(ptVar1,pwVar2);
  return;
}

Assistant:

static void f_check(t_pvalue* a_stack, std::index_sequence<A_i...>)
	{
		(xemmai::f_check<T_an>(a_stack[A_i], t_cs<L'a', L'r', L'g', L'u', L'm', L'e', L'n', L't'>() + typename t_n2s<A_i>::t()), ...);
	}